

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::MultiReporter::skipTest(MultiReporter *this,TestCaseInfo *testInfo)

{
  bool bVar1;
  reference this_00;
  IEventListener *pIVar2;
  unique_ptr<Catch::IEventListener> *reporterish;
  iterator __end1;
  iterator __begin1;
  vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
  *__range1;
  TestCaseInfo *testInfo_local;
  MultiReporter *this_local;
  
  __end1 = std::
           vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
           ::begin(&this->m_reporterLikes);
  reporterish = (unique_ptr<Catch::IEventListener> *)
                std::
                vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
                ::end(&this->m_reporterLikes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Catch::Detail::unique_ptr<Catch::IEventListener>_*,_std::vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>_>
                                *)&reporterish);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<Catch::Detail::unique_ptr<Catch::IEventListener>_*,_std::vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>_>
              ::operator*(&__end1);
    pIVar2 = Detail::unique_ptr<Catch::IEventListener>::operator->(this_00);
    (*pIVar2->_vptr_IEventListener[0x12])(pIVar2,testInfo);
    __gnu_cxx::
    __normal_iterator<Catch::Detail::unique_ptr<Catch::IEventListener>_*,_std::vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void MultiReporter::skipTest( TestCaseInfo const& testInfo ) {
        for ( auto& reporterish : m_reporterLikes ) {
            reporterish->skipTest( testInfo );
        }
    }